

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_bytes.cpp
# Opt level: O3

void __thiscall
duckdb::FormatBytesFunction<1024l>
          (duckdb *this,DataChunk *args,ExpressionState *state,Vector *result)

{
  UnifiedVectorFormat *pUVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  void *dataptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar6;
  undefined8 uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  reference vector;
  UnifiedVectorFormat *pUVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t iVar12;
  idx_t extraout_RDX_01;
  idx_t idx;
  ulong uVar13;
  VectorType VVar14;
  idx_t idx_in_entry;
  long lVar15;
  UnifiedVectorFormat *pUVar16;
  ulong uVar17;
  undefined8 *puVar18;
  idx_t *piVar19;
  UnifiedVectorFormat *pUVar20;
  string_t sVar21;
  anon_struct_16_3_d7536bce_for_pointer aVar22;
  undefined8 local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  long local_88;
  unsigned_long local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this,0);
  pUVar1 = *(UnifiedVectorFormat **)(this + 0x18);
  VVar14 = (VectorType)state;
  if (*vector == (value_type)0x0) {
    duckdb::Vector::SetVectorType(VVar14);
    lVar15 = *(long *)(state + 0x20);
    lVar5 = *(long *)(vector + 0x20);
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector((Vector *)state);
    if (*(long *)(vector + 0x28) == 0) {
      if (pUVar1 != (UnifiedVectorFormat *)0x0) {
        piVar19 = (idx_t *)(lVar15 + 8);
        pUVar16 = (UnifiedVectorFormat *)0x0;
        iVar12 = extraout_RDX;
        do {
          sVar21 = UnaryLambdaWrapper::
                   Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                             (*(long *)(lVar5 + (long)pUVar16 * 8),(ValidityMask *)state,iVar12,
                              result);
          iVar12 = sVar21.value._8_8_;
          piVar19[-1] = sVar21.value._0_8_;
          *piVar19 = iVar12;
          pUVar16 = pUVar16 + 1;
          piVar19 = piVar19 + 2;
        } while (pUVar1 != pUVar16);
      }
    }
    else {
      *(long *)(state + 0x28) = *(long *)(vector + 0x28);
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(state + 0x30),
                 (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(vector + 0x30));
      *(undefined8 *)(state + 0x40) = *(undefined8 *)(vector + 0x40);
      if ((UnifiedVectorFormat *)0x3f < pUVar1 + 0x3f) {
        lVar15 = lVar15 + 8;
        uVar13 = 0;
        iVar12 = extraout_RDX_00;
        pUVar16 = (UnifiedVectorFormat *)0x0;
        do {
          if (*(long *)(vector + 0x28) == 0) {
            pUVar9 = pUVar16 + 0x40;
            if (pUVar1 <= pUVar16 + 0x40) {
              pUVar9 = pUVar1;
            }
LAB_00736a4a:
            pUVar20 = pUVar16;
            if (pUVar16 < pUVar9) {
              piVar19 = (idx_t *)((long)pUVar16 * 0x10 + lVar15);
              do {
                sVar21 = UnaryLambdaWrapper::
                         Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                                   (*(long *)(lVar5 + (long)pUVar16 * 8),(ValidityMask *)state,
                                    iVar12,result);
                iVar12 = sVar21.value._8_8_;
                piVar19[-1] = sVar21.value._0_8_;
                *piVar19 = iVar12;
                pUVar16 = pUVar16 + 1;
                piVar19 = piVar19 + 2;
                pUVar20 = pUVar9;
              } while (pUVar9 != pUVar16);
            }
          }
          else {
            uVar4 = *(ulong *)(*(long *)(vector + 0x28) + uVar13 * 8);
            pUVar9 = pUVar16 + 0x40;
            if (pUVar1 <= pUVar16 + 0x40) {
              pUVar9 = pUVar1;
            }
            pUVar20 = pUVar9;
            if (uVar4 != 0) {
              if (uVar4 == 0xffffffffffffffff) goto LAB_00736a4a;
              pUVar20 = pUVar16;
              if (pUVar16 < pUVar9) {
                local_88 = lVar5 + (long)pUVar16 * 8;
                piVar19 = (idx_t *)((long)pUVar16 * 0x10 + lVar15);
                uVar17 = 0;
                do {
                  if ((uVar4 >> (uVar17 & 0x3f) & 1) != 0) {
                    sVar21 = UnaryLambdaWrapper::
                             Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                                       (*(long *)(local_88 + uVar17 * 8),(ValidityMask *)state,
                                        iVar12,result);
                    iVar12 = sVar21.value._8_8_;
                    piVar19[-1] = sVar21.value._0_8_;
                    *piVar19 = iVar12;
                  }
                  uVar17 = uVar17 + 1;
                  piVar19 = piVar19 + 2;
                  pUVar20 = pUVar9;
                } while ((long)pUVar9 - (long)pUVar16 != uVar17);
              }
            }
          }
          uVar13 = uVar13 + 1;
          pUVar16 = pUVar20;
        } while (uVar13 != (ulong)(pUVar1 + 0x3f) >> 6);
      }
    }
  }
  else if (*vector == (value_type)0x2) {
    duckdb::Vector::SetVectorType(VVar14);
    paVar2 = *(anon_union_16_2_67f50693_for_value **)(state + 0x20);
    plVar3 = *(long **)(vector + 0x20);
    if ((*(byte **)(vector + 0x28) != (byte *)0x0) && ((**(byte **)(vector + 0x28) & 1) == 0)) {
      duckdb::ConstantVector::SetNull((Vector *)state,true);
      return;
    }
    duckdb::ConstantVector::SetNull((Vector *)state,false);
    aVar22 = (anon_struct_16_3_d7536bce_for_pointer)
             UnaryLambdaWrapper::
             Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                       (*plVar3,(ValidityMask *)state,idx,result);
    paVar2->pointer = aVar22;
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar1);
    duckdb::Vector::SetVectorType(VVar14);
    lVar15 = *(long *)(state + 0x20);
    FlatVector::VerifyFlatVector((Vector *)state);
    if (local_68 == 0) {
      if (pUVar1 != (UnifiedVectorFormat *)0x0) {
        lVar5 = *local_78;
        piVar19 = (idx_t *)(lVar15 + 8);
        pUVar16 = (UnifiedVectorFormat *)0x0;
        iVar12 = extraout_RDX_01;
        do {
          pUVar9 = pUVar16;
          if (lVar5 != 0) {
            pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar5 + (long)pUVar16 * 4);
          }
          sVar21 = UnaryLambdaWrapper::
                   Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                             (*(long *)(local_70 + (long)pUVar9 * 8),(ValidityMask *)state,iVar12,
                              result);
          iVar12 = sVar21.value._8_8_;
          piVar19[-1] = sVar21.value._0_8_;
          *piVar19 = iVar12;
          pUVar16 = pUVar16 + 1;
          piVar19 = piVar19 + 2;
        } while (pUVar1 != pUVar16);
      }
    }
    else if (pUVar1 != (UnifiedVectorFormat *)0x0) {
      lVar5 = *local_78;
      puVar18 = (undefined8 *)(lVar15 + 8);
      pUVar16 = (UnifiedVectorFormat *)0x0;
      do {
        pUVar9 = pUVar16;
        if (lVar5 != 0) {
          pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar5 + (long)pUVar16 * 4);
        }
        dataptr = *(void **)(local_68 + ((ulong)pUVar9 >> 6) * 8);
        if (((ulong)dataptr >> ((ulong)pUVar9 & 0x3f) & 1) == 0) {
          _Var11._M_head_impl = *(unsigned_long **)(state + 0x28);
          if (_Var11._M_head_impl == (unsigned_long *)0x0) {
            local_80 = *(unsigned_long *)(state + 0x40);
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_80);
            p_Var8 = p_Stack_90;
            uVar7 = local_98;
            local_98 = 0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(state + 0x38);
            *(undefined8 *)(state + 0x30) = uVar7;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(state + 0x38) = p_Var8;
            if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
               p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (state + 0x30));
            _Var11._M_head_impl =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(unsigned_long **)(state + 0x28) = _Var11._M_head_impl;
          }
          bVar6 = (byte)pUVar16 & 0x3f;
          _Var11._M_head_impl[(ulong)pUVar16 >> 6] =
               _Var11._M_head_impl[(ulong)pUVar16 >> 6] &
               (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        }
        else {
          sVar21 = UnaryLambdaWrapper::
                   Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                             (*(long *)(local_70 + (long)pUVar9 * 8),(ValidityMask *)state,
                              (ulong)pUVar9 >> 6,dataptr);
          puVar18[-1] = sVar21.value._0_8_;
          *puVar18 = sVar21.value._8_8_;
        }
        pUVar16 = pUVar16 + 1;
        puVar18 = puVar18 + 2;
      } while (pUVar1 != pUVar16);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void FormatBytesFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	UnaryExecutor::Execute<int64_t, string_t>(args.data[0], result, args.size(), [&](int64_t bytes) {
		bool is_negative = bytes < 0;
		idx_t unsigned_bytes;
		if (bytes < 0) {
			if (bytes == NumericLimits<int64_t>::Minimum()) {
				unsigned_bytes = idx_t(NumericLimits<int64_t>::Maximum()) + 1;
			} else {
				unsigned_bytes = idx_t(-bytes);
			}
		} else {
			unsigned_bytes = idx_t(bytes);
		}
		return StringVector::AddString(result, (is_negative ? "-" : "") +
		                                           StringUtil::BytesToHumanReadableString(unsigned_bytes, MULTIPLIER));
	});
}